

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auxil.c
# Opt level: O0

void reset_info(OSQPInfo *info)

{
  long in_RDI;
  
  *(undefined8 *)(in_RDI + 0x58) = 0;
  *(undefined8 *)(in_RDI + 0x68) = 0;
  update_status(info,in_RDI);
  *(undefined8 *)(in_RDI + 0x78) = 0;
  return;
}

Assistant:

void reset_info(OSQPInfo *info) {
#ifdef PROFILING

  // Initialize info values.
  info->solve_time = 0.0;  // Solve time to zero
# ifndef EMBEDDED
  info->polish_time = 0.0; // Polish time to zero
# endif /* ifndef EMBEDDED */

  // NB: We do not reset the setup_time because it is performed only once
#endif /* ifdef PROFILING */

  update_status(info, OSQP_UNSOLVED); // Problem is unsolved

#if EMBEDDED != 1
  info->rho_updates = 0;              // Rho updates are now 0
#endif /* if EMBEDDED != 1 */
}